

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

bool __thiscall r_exec::HLPBindingMap::need_binding(HLPBindingMap *this,Code *pattern)

{
  bool bVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RDX;
  undefined4 local_28;
  ushort local_24;
  ushort local_22;
  Atom p_atom;
  uint16_t i_1;
  uint16_t i;
  Code *pattern_local;
  HLPBindingMap *this_local;
  
  _p_atom = pattern;
  (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
  sVar3 = r_code::Atom::asOpcode();
  if (sVar3 != Opcodes::Ont) {
    (*(_p_atom->super__Object)._vptr__Object[4])(_p_atom,0);
    sVar3 = r_code::Atom::asOpcode();
    if (sVar3 != Opcodes::Ent) {
      (*(_p_atom->super__Object)._vptr__Object[4])(_p_atom,0);
      sVar3 = r_code::Atom::asOpcode();
      if (sVar3 != Opcodes::Mdl) {
        (*(_p_atom->super__Object)._vptr__Object[4])(_p_atom,0);
        sVar3 = r_code::Atom::asOpcode();
        if (sVar3 != Opcodes::Cst) {
          for (local_22 = 0; uVar4 = (uint)local_22,
              uVar5 = (*(_p_atom->super__Object)._vptr__Object[10])(), uVar4 < (uVar5 & 0xffff);
              local_22 = local_22 + 1) {
            iVar6 = (*(_p_atom->super__Object)._vptr__Object[9])
                              (_p_atom,(ulong)local_22,extraout_RDX,(ulong)local_22);
            bVar1 = need_binding(this,(Code *)CONCAT44(extraout_var,iVar6));
            if (bVar1) {
              this_local._7_1_ = 1;
              goto LAB_00209237;
            }
          }
          for (local_24 = 1; uVar4 = (uint)local_24,
              uVar5 = (*(_p_atom->super__Object)._vptr__Object[6])(), uVar4 < (uVar5 & 0xffff);
              local_24 = local_24 + 1) {
            iVar6 = (*(_p_atom->super__Object)._vptr__Object[4])(_p_atom,(ulong)local_24);
            local_28 = *(undefined4 *)CONCAT44(extraout_var_00,iVar6);
            bVar2 = r_code::Atom::getDescriptor();
            if (bVar2 == 0x86) {
              this_local._7_1_ = 1;
              bVar1 = true;
            }
            else {
              if (bVar2 - 0xc6 < 2) {
                bVar2 = r_code::Atom::getAtomCount();
                local_24 = local_24 + bVar2;
              }
              bVar1 = false;
            }
            r_code::Atom::~Atom((Atom *)&local_28);
            if (bVar1) goto LAB_00209237;
          }
          this_local._7_1_ = 0;
          goto LAB_00209237;
        }
      }
    }
  }
  this_local._7_1_ = 0;
LAB_00209237:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HLPBindingMap::need_binding(Code *pattern) const
{
    if (pattern->code(0).asOpcode() == Opcodes::Ont ||
        pattern->code(0).asOpcode() == Opcodes::Ent ||
        pattern->code(0).asOpcode() == Opcodes::Mdl ||
        pattern->code(0).asOpcode() == Opcodes::Cst) {
        return false;
    }

    for (uint16_t i = 0; i < pattern->references_size(); ++i) {
        if (need_binding(pattern->get_reference(i))) {
            return true;
        }
    }

    for (uint16_t i = 1; i < pattern->code_size(); ++i) {
        Atom p_atom = pattern->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::VL_PTR:
            return true;

        case Atom::TIMESTAMP:
        case Atom::STRING:
            i += p_atom.getAtomCount();
            break;

        default:
            break;
        }
    }

    return false;
}